

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int rtosc::enum_key(MetaContainer meta,char *value)

{
  int iVar1;
  char *__haystack;
  char *pcVar2;
  MetaContainer *this;
  MetaIterator MVar3;
  MetaIterator __begin1;
  MetaIterator local_40;
  MetaContainer local_30;
  
  this = &local_30;
  local_30.str_ptr = meta.str_ptr;
  local_40 = Port::MetaContainer::begin(this);
  __haystack = local_40.title;
  MVar3 = Port::MetaContainer::end(this);
  do {
    if (__haystack == MVar3.title) {
      return -0x80000000;
    }
    pcVar2 = strstr(__haystack,"map ");
    if (pcVar2 != (char *)0x0) {
      iVar1 = strcmp(local_40.value,value);
      if (iVar1 == 0) {
        iVar1 = atoi(__haystack + 4);
        return iVar1;
      }
    }
    Port::MetaIterator::operator++(&local_40);
    __haystack = local_40.title;
  } while( true );
}

Assistant:

int rtosc::enum_key(Port::MetaContainer meta, const char* value)
{
    int result = std::numeric_limits<int>::min();

    for(auto m:meta)
    if(strstr(m.title, "map "))
    if(!strcmp(m.value, value))
    {
        result = atoi(m.title+4);
        break;
    }

    assert(!meta["min"] || result >= atoi(meta["min"]));
    assert(!meta["max"] || result <= atoi(meta["max"]));

    return result;
}